

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_decay.cpp
# Opt level: O1

void __thiscall
particle_decay::perform_decays
          (particle_decay *this,particle_info *mother,
          vector<particle_info,_std::allocator<particle_info>_> *daughter_list)

{
  _Rb_tree_header *p_Var1;
  pointer *ppaVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  element_type *peVar6;
  undefined4 uVar7;
  uint uVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  pointer paVar11;
  iterator iVar12;
  _Base_ptr p_Var13;
  long lVar14;
  _Base_ptr p_Var15;
  particle_info *ppVar16;
  ulong uVar17;
  byte bVar18;
  double dVar19;
  double dVar20;
  particle_info daughter1;
  particle_decay_info mother_decay_info;
  particle_info daughter2;
  particle_info daughter3;
  int local_21c;
  particle_info local_218;
  int local_1a0;
  undefined1 *local_198;
  undefined8 local_190;
  undefined1 local_188 [16];
  double local_178;
  double dStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  int local_148;
  vector<decay_channel_info,_std::allocator<decay_channel_info>_> local_140;
  int local_128;
  particle_info local_120;
  particle_info local_a8;
  
  bVar18 = 0;
  local_190 = 0;
  local_188[0] = 0;
  local_140.super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var15 = (this->resonance_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->resonance_table_)._M_t._M_impl.super__Rb_tree_header;
  p_Var13 = &p_Var1->_M_header;
  if (p_Var15 != (_Base_ptr)0x0) {
    do {
      if (mother->monval <= (int)p_Var15[1]._M_color) {
        p_Var13 = p_Var15;
      }
      p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color < mother->monval];
    } while (p_Var15 != (_Base_ptr)0x0);
  }
  p_Var15 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
     (p_Var15 = p_Var13, mother->monval < (int)p_Var13[1]._M_color)) {
    p_Var15 = &p_Var1->_M_header;
  }
  local_198 = local_188;
  if ((_Rb_tree_header *)p_Var15 == p_Var1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warning: pdg ",0xd);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cout,mother->monval);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," not found, might be some table inconsistency",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    goto LAB_0013599a;
  }
  pmVar9 = std::
           map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
           ::operator[](&this->resonance_table_,&mother->monval);
  local_1a0 = pmVar9->monval;
  std::__cxx11::string::_M_assign((string *)&local_198);
  local_148 = pmVar9->stable;
  local_178 = pmVar9->mass;
  dStack_170 = pmVar9->width;
  local_168._0_4_ = pmVar9->gspin;
  local_168._4_4_ = pmVar9->baryon;
  uStack_160._0_4_ = pmVar9->strange;
  uStack_160._4_4_ = pmVar9->charm;
  local_158._0_4_ = pmVar9->bottom;
  local_158._4_4_ = pmVar9->gisospin;
  uStack_150._0_4_ = pmVar9->charge;
  uStack_150._4_4_ = pmVar9->decays;
  std::vector<decay_channel_info,_std::allocator<decay_channel_info>_>::operator=
            (&local_140,&pmVar9->decay_channels);
  local_128 = pmVar9->sign;
  if (local_148 == 1) {
    iVar12._M_current =
         (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar12._M_current ==
        (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<particle_info,std::allocator<particle_info>>::
      _M_realloc_insert<particle_info_const&>
                ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar12,mother)
      ;
      goto LAB_0013599a;
    }
    lVar14 = 0xf;
  }
  else {
    uVar8 = uStack_150._4_4_;
    uVar17 = (ulong)uStack_150._4_4_;
    peVar6 = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar19 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(peVar6->ran_generator)._M_t.
                           super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           .
                           super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                       );
    if (0 < (int)uVar8) {
      dVar3 = (peVar6->rand_uniform_dist)._M_param._M_a;
      dVar20 = 0.0;
      paVar11 = local_140.
                super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        dVar20 = dVar20 + paVar11->branching_ratio;
        if (dVar19 * ((peVar6->rand_uniform_dist)._M_param._M_b - dVar3) + dVar3 < dVar20)
        goto LAB_0013579a;
        paVar11 = paVar11 + 1;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    paVar11 = (pointer)0x0;
LAB_0013579a:
    if (paVar11->decay_Npart == 3) {
      local_21c = paVar11->decay_part[0];
      iVar4 = paVar11->decay_part[1];
      iVar5 = paVar11->decay_part[2];
      local_218.monval = local_21c;
      local_120.monval = iVar4;
      local_a8.monval = iVar5;
      pmVar9 = std::
               map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
               ::at(&this->resonance_table_,&local_21c);
      local_218.mass = pmVar9->mass;
      local_21c = iVar4;
      pmVar9 = std::
               map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
               ::at(&this->resonance_table_,&local_21c);
      local_120.mass = pmVar9->mass;
      local_21c = iVar5;
      pmVar9 = std::
               map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
               ::at(&this->resonance_table_,&local_21c);
      local_a8.mass = pmVar9->mass;
      perform_three_body_decay(this,mother,&local_218,&local_120,&local_a8);
      iVar12._M_current =
           (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<particle_info,std::allocator<particle_info>>::
        _M_realloc_insert<particle_info_const&>
                  ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar12,
                   &local_218);
      }
      else {
        ppVar16 = &local_218;
        for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
          uVar7 = *(undefined4 *)&ppVar16->field_0x4;
          (iVar12._M_current)->monval = ppVar16->monval;
          *(undefined4 *)&(iVar12._M_current)->field_0x4 = uVar7;
          ppVar16 = (particle_info *)((long)ppVar16 + ((ulong)bVar18 * -2 + 1) * 8);
          iVar12._M_current = iVar12._M_current + (ulong)bVar18 * -0x10 + 8;
        }
        ppaVar2 = &(daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
      iVar12._M_current =
           (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<particle_info,std::allocator<particle_info>>::
        _M_realloc_insert<particle_info_const&>
                  ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar12,
                   &local_120);
      }
      else {
        ppVar16 = &local_120;
        for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
          uVar7 = *(undefined4 *)&ppVar16->field_0x4;
          (iVar12._M_current)->monval = ppVar16->monval;
          *(undefined4 *)&(iVar12._M_current)->field_0x4 = uVar7;
          ppVar16 = (particle_info *)((long)ppVar16 + ((ulong)bVar18 * -2 + 1) * 8);
          iVar12._M_current = iVar12._M_current + (ulong)bVar18 * -0x10 + 8;
        }
        ppaVar2 = &(daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
      iVar12._M_current =
           (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<particle_info,std::allocator<particle_info>>::
        _M_realloc_insert<particle_info_const&>
                  ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar12,
                   &local_a8);
        goto LAB_0013599a;
      }
      mother = &local_a8;
    }
    else {
      if (paVar11->decay_Npart != 2) goto LAB_0013599a;
      local_218.monval = paVar11->decay_part[0];
      iVar4 = paVar11->decay_part[1];
      local_120.monval = iVar4;
      local_a8.monval = local_218.monval;
      pmVar9 = std::
               map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
               ::at(&this->resonance_table_,&local_a8.monval);
      local_218.mass = pmVar9->mass;
      local_a8.monval = iVar4;
      pmVar9 = std::
               map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
               ::at(&this->resonance_table_,&local_a8.monval);
      local_120.mass = pmVar9->mass;
      perform_two_body_decay(this,mother,&local_218,&local_120);
      iVar12._M_current =
           (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<particle_info,std::allocator<particle_info>>::
        _M_realloc_insert<particle_info_const&>
                  ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar12,
                   &local_218);
      }
      else {
        ppVar16 = &local_218;
        for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
          uVar7 = *(undefined4 *)&ppVar16->field_0x4;
          (iVar12._M_current)->monval = ppVar16->monval;
          *(undefined4 *)&(iVar12._M_current)->field_0x4 = uVar7;
          ppVar16 = (particle_info *)((long)ppVar16 + ((ulong)bVar18 * -2 + 1) * 8);
          iVar12._M_current = iVar12._M_current + (ulong)bVar18 * -0x10 + 8;
        }
        ppaVar2 = &(daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
      iVar12._M_current =
           (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<particle_info,std::allocator<particle_info>>::
        _M_realloc_insert<particle_info_const&>
                  ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar12,
                   &local_120);
        goto LAB_0013599a;
      }
      mother = &local_120;
    }
    lVar14 = 0xf;
  }
  for (; lVar14 != 0; lVar14 = lVar14 + -1) {
    uVar7 = *(undefined4 *)&mother->field_0x4;
    (iVar12._M_current)->monval = mother->monval;
    *(undefined4 *)&(iVar12._M_current)->field_0x4 = uVar7;
    mother = (particle_info *)((long)mother + (ulong)bVar18 * -0x10 + 8);
    iVar12._M_current = iVar12._M_current + (ulong)bVar18 * -0x10 + 8;
  }
  ppaVar2 = &(daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  *ppaVar2 = *ppaVar2 + 1;
LAB_0013599a:
  if (local_140.super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  return;
}

Assistant:

void particle_decay::perform_decays(
    particle_info &mother, std::vector<particle_info> &daughter_list) {
    particle_decay_info mother_decay_info;
    if (resonance_table_.find(mother.monval) == resonance_table_.end()) {
        std::cout << "Warning: pdg " << mother.monval
                  << " not found, might be some table inconsistency"
                  << std::endl;
        return;
    } else {
        mother_decay_info = resonance_table_[mother.monval];
    }
    if (mother_decay_info.stable == 1) {
        // the particle is a stable particle
        daughter_list.push_back(mother);
        return;
    }
    // std::cout << "Decaying " << mother_decay_info->name
    //           << "(" << mother_decay_info->monval << ") ..." << std::endl;
    int N_decay_channel = mother_decay_info.decays;
    double random_local = ran_gen_ptr_->rand_uniform();
    double cumulated_branching_ratio = 0.0;
    decay_channel_info *picked_channel = NULL;
    for (int i_channel = 0; i_channel < N_decay_channel; i_channel++) {
        cumulated_branching_ratio +=
            mother_decay_info.decay_channels[i_channel].branching_ratio;
        if (cumulated_branching_ratio > random_local) {
            picked_channel = &mother_decay_info.decay_channels[i_channel];
            break;
        }
    }
    int N_decay_part = picked_channel->decay_Npart;
    if (N_decay_part == 2) {
        particle_info daughter1;
        particle_info daughter2;
        int decay_part1_monval = picked_channel->decay_part[0];
        int decay_part2_monval = picked_channel->decay_part[1];
        daughter1.monval = decay_part1_monval;
        daughter2.monval = decay_part2_monval;
        daughter1.mass = get_particle_mass(decay_part1_monval);
        daughter2.mass = get_particle_mass(decay_part2_monval);
        perform_two_body_decay(mother, daughter1, daughter2);
        daughter_list.push_back(daughter1);
        daughter_list.push_back(daughter2);
    } else if (N_decay_part == 3) {
        particle_info daughter1;
        particle_info daughter2;
        particle_info daughter3;
        int decay_part1_monval = picked_channel->decay_part[0];
        int decay_part2_monval = picked_channel->decay_part[1];
        int decay_part3_monval = picked_channel->decay_part[2];
        daughter1.monval = decay_part1_monval;
        daughter2.monval = decay_part2_monval;
        daughter3.monval = decay_part3_monval;
        daughter1.mass = get_particle_mass(decay_part1_monval);
        daughter2.mass = get_particle_mass(decay_part2_monval);
        daughter3.mass = get_particle_mass(decay_part3_monval);
        perform_three_body_decay(mother, daughter1, daughter2, daughter3);
        daughter_list.push_back(daughter1);
        daughter_list.push_back(daughter2);
        daughter_list.push_back(daughter3);
    }
}